

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

char * CMakeWriter::get_package_dependency_output_name(string *package_dependency)

{
  bool bVar1;
  string *package_dependency_local;
  
  bVar1 = std::operator==(package_dependency,"Freetype");
  if (bVar1) {
    package_dependency_local = (string *)anon_var_dwarf_2d9ac;
  }
  else {
    bVar1 = std::operator==(package_dependency,"OpenGL");
    if (bVar1) {
      package_dependency_local = (string *)anon_var_dwarf_2d9c4;
    }
    else {
      package_dependency_local = (string *)std::__cxx11::string::c_str();
    }
  }
  return (char *)package_dependency_local;
}

Assistant:

static const char * get_package_dependency_output_name(const std::string & package_dependency)
	{
		/*
		CMake find_package scripts do not always follow the convention of outputting
		<package_name>_INCLUDE_DIRS and <package_name>_LIBRARIES. sometimes a script
		will capitalize the package name or perhaps something more wild. for now I only
		came across the FindFreetype.cmake script which doesn't stick to convention,
		but since CMake in no way enforces the convention, other exceptions may exist.
		in either case, we normalize known exceptions here since it's bad for automation
		to have to deal with these exceptions..
		*/

		if (package_dependency == "Freetype")
			return "FREETYPE";
		else if (package_dependency == "OpenGL")
			return "OPENGL";
		else
			return package_dependency.c_str();
	}